

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O1

optional<char16_t> sjisToUnicode(unsigned_short SjisCharacter)

{
  ulong uVar1;
  uint uVar2;
  char16_t *pcVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  
  uVar4 = (uint)CONCAT62(in_register_0000003a,SjisCharacter);
  uVar2 = 0x10000;
  if (0x7f < uVar4) {
    if (SjisCharacter < 0x100) {
      pcVar3 = L"\x80\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff｡｢｣､･ｦｧｨｩｪｫｬｭｮｯｰｱｲｳｴｵｶｷｸｹｺｻｼｽｾｿﾀﾁﾂﾃﾄﾅﾆﾇﾈﾉﾊﾋﾌﾍﾎﾏﾐﾑﾒﾓﾔﾕﾖﾗﾘﾙﾚﾛﾜﾝﾞﾟ\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff"
               + (uVar4 - 0x80);
    }
    else {
      uVar2 = 0;
      if ((SjisCharacter & 0xc0) == 0) goto LAB_001506d8;
      if ((uVar4 + 0x7f00 & 0xffff) < 0x400) {
        uVar1 = (ulong)((uVar4 + 0x7ec0) - (uVar4 + 0x7ec0 >> 2 & 0x3fc0) & 0xffff);
        pcVar3 = 
        L"\x3000、。，．・：；？！゛゜´｀¨＾￣＿ヽヾゝゞ〃仝々〆〇ー―‐／＼～∥｜…‥‘’“”（）〔〕［］｛｝〈〉《》「」『』【】＋－±×\xffff÷＝≠＜＞≦≧∞∴♂♀°′″℃￥＄￠￡％＃＆＊＠§☆★○●◎◇◆□■△▲▽▼※〒→←↑↓〓\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff∈∋⊆⊇⊂⊃∪∩\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff∧∨￢⇒⇔∀∃\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff∠⊥⌒∂∇≡≒≪≫√∽∝∵∫∬\xffff\xffff\xffff\xffff\xffff\xffff\xffffÅ‰♯♭♪†‡¶\xffff\xffff\xffff\xffff◯\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff０１２３４５６７８９\xffff\xffff\xffff\xffff\xffff\xffff\xffffＡＢＣＤＥＦＧＨＩＪＫＬＭＮＯＰＱＲＳＴＵＶＷＸＹＺ\xffff\xffff\xffff\xffff\xffff\xffff\xffffａｂｃｄｅｆｇｈｉｊｋｌｍｎｏｐｑｒｓｔｕｖｗｘｙｚ\xffff\xffff\xffff\xffffぁあぃいぅうぇえぉおかがきぎくぐけげこごさざしじすずせぜそぞただちぢっつづてでとどなにぬねのはばぱひびぴふぶぷへべぺほぼぽまみむめもゃやゅゆょよらりるれろゎわゐゑをん\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffffァアィイゥウェエォオカガキギクグケゲコゴサザシジスズセゼソゾタダチヂッツヅテデトドナニヌネノハバパヒビピフブプヘベペホボポマミ\xffffムメモャヤュユョヨラリルレロヮワヰヱヲンヴヵヶ\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffffΑΒΓΔΕΖΗΘΙΚΛΜΝΞΟΠΡΣΤΥΦΧΨΩ\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffffαβγδεζηθικλμνξοπρστυφχψω\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffffАБВГДЕЁЖЗИЙКЛМНОПРСТУФХЦЧШЩЪЫЬЭЮЯ\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffffабвгдеёжзийклмн\xffffопрстуфхцчшщъыьэюя\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff─│┌┐┘└├┬┤┴┼━┃┏┓┛┗┣┳┫┻╋┠┯┨┷┿┝┰┥┸╂\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff"
        ;
      }
      else if ((uVar4 + 0x7900 & 0xffff) < 0x1900) {
        uVar1 = (ulong)((uVar4 + 0x78c0) - (uVar4 + 0x78c0 >> 2 & 0x3fc0) & 0xffff);
        pcVar3 = 
        L"①②③④⑤⑥⑦⑧⑨⑩⑪⑫⑬⑭⑮⑯⑰⑱⑲⑳ⅠⅡⅢⅣⅤⅥⅦⅧⅨⅩ\xffff㍉㌔㌢㍍㌘㌧㌃㌶㍑㍗㌍㌦㌣㌫㍊㌻㎜㎝㎞㎎㎏㏄㎡\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff㍻\xffff〝〟№㏍℡㊤㊥㊦㊧㊨㈱㈲㈹㍾㍽㍼≒≡∫∮∑√⊥∠∟⊿∵∩∪\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff\xffff亜唖娃阿哀愛挨姶逢葵茜穐悪握渥旭葦芦鯵梓圧斡扱宛姐虻飴絢綾鮎或粟袷安庵按暗案闇鞍杏以伊位依偉囲夷委威尉惟意慰易椅為畏異移維緯胃萎衣謂違遺医井亥域育郁磯一壱溢逸稲茨芋鰯允印咽員因姻引飲淫胤蔭\xffff\xffff\xffff院陰隠韻吋右宇烏羽迂雨卯鵜窺丑碓臼渦嘘唄欝蔚鰻姥厩浦瓜閏噂云運雲荏餌叡営嬰影映曳栄永泳洩瑛盈穎頴英衛詠鋭液疫益駅悦謁越閲榎厭円\xffff園堰奄宴延怨掩援沿演炎焔煙燕猿縁艶苑薗遠鉛鴛塩於汚甥凹央奥往応押旺横欧殴王翁襖鴬鴎黄岡沖荻億屋憶臆桶牡乙俺卸恩温穏音下化仮何伽価佳加可嘉夏嫁家寡科暇果架歌河火珂禍禾稼箇花苛茄荷華菓蝦課嘩貨迦過霞蚊俄峨我牙画臥芽蛾賀雅餓駕介会解回塊壊廻快怪悔恢懐戒拐改\xffff\xffff\xffff魁晦械海灰界皆絵芥蟹開階貝凱劾外咳害崖慨概涯碍蓋街該鎧骸浬馨蛙垣柿蛎鈎劃嚇各廓拡撹格核殻獲確穫覚角赫較郭閣隔革学岳楽額顎掛笠樫\xffff橿梶鰍潟割喝恰括活渇滑葛褐轄且鰹叶椛樺鞄株兜竃蒲釜鎌噛鴨栢茅萱粥刈苅瓦乾侃冠寒刊勘勧巻..." /* TRUNCATED STRING LITERAL */
        ;
      }
      else if ((uVar4 + 0x2000 & 0xffff) < 0xb00) {
        uVar1 = (ulong)((uVar4 + 0x1fc0) - (uVar4 + 0x1fc0 >> 2 & 0x3fc0) & 0xffff);
        pcVar3 = 
        L"漾漓滷澆潺潸澁澀潯潛濳潭澂潼潘澎澑濂潦澳澣澡澤澹濆澪濟濕濬濔濘濱濮濛瀉瀋濺瀑瀁瀏濾瀛瀚潴瀝瀘瀟瀰瀾瀲灑灣炙炒炯烱炬炸炳炮烟烋烝\xffff烙焉烽焜焙煥煕熈煦煢煌煖煬熏燻熄熕熨熬燗熹熾燒燉燔燎燠燬燧燵燼燹燿爍爐爛爨爭爬爰爲爻爼爿牀牆牋牘牴牾犂犁犇犒犖犢犧犹犲狃狆狄狎狒狢狠狡狹狷倏猗猊猜猖猝猴猯猩猥猾獎獏默獗獪獨獰獸獵獻獺珈玳珎玻珀珥珮珞璢琅瑯琥珸琲琺瑕琿瑟瑙瑁瑜瑩瑰瑣瑪瑶瑾璋璞璧瓊瓏瓔珱\xffff\xffff\xffff瓠瓣瓧瓩瓮瓲瓰瓱瓸瓷甄甃甅甌甎甍甕甓甞甦甬甼畄畍畊畉畛畆畚畩畤畧畫畭畸當疆疇畴疊疉疂疔疚疝疥疣痂疳痃疵疽疸疼疱痍痊痒痙痣痞痾痿\xffff痼瘁痰痺痲痳瘋瘍瘉瘟瘧瘠瘡瘢瘤瘴瘰瘻癇癈癆癜癘癡癢癨癩癪癧癬癰癲癶癸發皀皃皈皋皎皖皓皙皚皰皴皸皹皺盂盍盖盒盞盡盥盧盪蘯盻眈眇眄眩眤眞眥眦眛眷眸睇睚睨睫睛睥睿睾睹瞎瞋瞑瞠瞞瞰瞶瞹瞿瞼瞽瞻矇矍矗矚矜矣矮矼砌砒礦砠礪硅碎硴碆硼碚碌碣碵碪碯磑磆磋磔碾碼磅磊磬\xffff\xffff\xffff磧磚磽磴礇礒礑礙礬礫祀祠祗祟祚祕祓祺祿禊禝禧齋禪禮禳禹禺秉秕秧秬秡秣稈稍稘稙稠稟禀稱稻稾稷穃穗穉穡穢穩龝穰穹穽窈窗窕窘窖窩竈窰\xffff窶竅竄窿邃竇竊竍竏竕竓站竚竝竡竢竦竭竰笂笏笊笆笳笘笙笞笵笨笶筐筺笄筍笋筌筅筵筥筴筧筰筱筬筮箝箘箟箍箜箚箋箒箏筝箙篋篁篌篏箴篆篝篩簑簔篦篥籠簀簇簓篳篷簗簍篶簣簧簪簟簷簫簽籌籃籔籏籀籐籘籟籤籖籥籬籵粃粐粤粭粢粫粡粨粳粲粱粮粹粽糀糅糂糘糒糜糢鬻糯糲糴糶糺紆\xffff\xffff\xffff紂紜紕紊絅絋紮紲紿紵絆絳絖絎絲絨絮絏絣經綉絛綏絽綛綺綮綣綵緇綽綫總綢綯緜綸綟綰緘緝緤緞緻緲緡縅縊縣縡縒縱縟縉縋縢繆繦縻縵縹繃縷\xffff縲縺繧繝繖繞繙繚繹繪繩繼繻纃緕繽辮繿纈纉續纒纐纓纔纖纎纛纜缸缺罅罌罍罎罐网罕罔罘罟罠罨..." /* TRUNCATED STRING LITERAL */
        ;
      }
      else {
        uVar2 = 0;
        if (0x1ff < (uVar4 + 0x1300 & 0xffff)) goto LAB_001506d8;
        uVar1 = (ulong)((uVar4 + 0x12c0) - (uVar4 + 0x12c0 >> 2 & 0x3fc0) & 0xffff);
        pcVar3 = 
        L"纊褜鍈銈蓜俉炻昱棈鋹曻彅丨仡仼伀伃伹佖侒侊侚侔俍偀倢俿倞偆偰偂傔僴僘兊兤冝冾凬刕劜劦勀勛匀匇匤卲厓厲叝﨎咜咊咩哿喆坙坥垬埈埇﨏\xffff塚增墲夋奓奛奝奣妤妺孖寀甯寘寬尞岦岺峵崧嵓﨑嵂嵭嶸嶹巐弡弴彧德忞恝悅悊惞惕愠惲愑愷愰憘戓抦揵摠撝擎敎昀昕昻昉昮昞昤晥晗晙晴晳暙暠暲暿曺朎朗杦枻桒柀栁桄棏﨓楨﨔榘槢樰橫橆橳橾櫢櫤毖氿汜沆汯泚洄涇浯涖涬淏淸淲淼渹湜渧渼溿澈澵濵瀅瀇瀨炅炫焏焄煜煆煇凞燁燾犱\xffff\xffff\xffff犾猤猪獷玽珉珖珣珒琇珵琦琪琩琮瑢璉璟甁畯皂皜皞皛皦益睆劯砡硎硤硺礰礼神祥禔福禛竑竧靖竫箞精絈絜綷綠緖繒罇羡羽茁荢荿菇菶葈蒴蕓蕙\xffff蕫﨟薰蘒﨡蠇裵訒訷詹誧誾諟諸諶譓譿賰賴贒赶﨣軏﨤逸遧郞都鄕鄧釚釗釞釭釮釤釥鈆鈐鈊鈺鉀鈼鉎鉙鉑鈹鉧銧鉷鉸鋧鋗鋙鋐﨧鋕鋠鋓錥錡鋻﨨錞鋿錝錂鍰鍗鎤鏆鏞鏸鐱鑅鑈閒隆﨩隝隯霳霻靃靍靏靑靕顗顥飯飼餧館馞驎髙髜魵魲鮏鮱鮻鰀鵰鵫鶴鸙黑\xffff\xffffⅰⅱⅲⅳⅴⅵⅶⅷⅸⅹ￢￤＇＂\xffff\xffff\xffff"
        ;
      }
      pcVar3 = pcVar3 + uVar1;
    }
    uVar4 = (uint)(ushort)*pcVar3;
    uVar2 = 0x10000;
  }
LAB_001506d8:
  return (_Optional_base<char16_t,_true,_true>)
         (_Optional_base<char16_t,_true,_true>)(uVar4 & 0xffff | uVar2);
}

Assistant:

std::optional<char16_t> sjisToUnicode(unsigned short SjisCharacter)
{
	if (SjisCharacter < 0x80)
	{
		return SjisCharacter;
	} else if (SjisCharacter < 0x100)
	{
		return SjisToUnicodeTable1[SjisCharacter-0x80];
	}

	if ((SjisCharacter & 0xFF) < 0x40)
		return std::nullopt;

	if (SjisCharacter >= 0x8100 && SjisCharacter < 0x8500)
	{
		SjisCharacter -= 0x8140;
		SjisCharacter -= (SjisCharacter >> 8) * 0x40;
		return SjisToUnicodeTable2[SjisCharacter];
	} else if (SjisCharacter >= 0x8700 && SjisCharacter < 0xA000)
	{
		SjisCharacter -= 0x8740;
		SjisCharacter -= (SjisCharacter >> 8) * 0x40;
		return SjisToUnicodeTable3[SjisCharacter];
	} else if (SjisCharacter >= 0xE000 && SjisCharacter < 0xEB00)
	{
		SjisCharacter -= 0xE040;
		SjisCharacter -= (SjisCharacter >> 8) * 0x40;
		return SjisToUnicodeTable4[SjisCharacter];
	} else if (SjisCharacter >= 0xED00 && SjisCharacter < 0xEF00)
	{
		SjisCharacter -= 0xED40;
		SjisCharacter -= (SjisCharacter >> 8) * 0x40;
		return SjisToUnicodeTable5[SjisCharacter];
	} else {
		return std::nullopt;
	}
}